

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libc_wrappers.c
# Opt level: O3

char * gotcha_strstr(char *searchIn,char *searchFor)

{
  char *pcVar1;
  long lVar2;
  char cVar3;
  long lVar4;
  
  if ((*searchFor != '\0') && (cVar3 = *searchIn, cVar3 != '\0')) {
    pcVar1 = searchIn + 1;
    lVar2 = 0;
    do {
      if (cVar3 == *searchFor) {
        cVar3 = searchFor[1];
        if (cVar3 == '\0') {
LAB_00103b11:
          return searchFor + lVar2;
        }
        lVar4 = 0;
        while( true ) {
          if (pcVar1[lVar4] == '\0') {
            return (char *)0x0;
          }
          if (cVar3 != pcVar1[lVar4]) break;
          cVar3 = searchFor[lVar4 + 2];
          lVar4 = lVar4 + 1;
          if (cVar3 == '\0') goto LAB_00103b11;
        }
      }
      cVar3 = searchIn[lVar2 + 1];
      lVar2 = lVar2 + 1;
      pcVar1 = pcVar1 + 1;
    } while (cVar3 != '\0');
  }
  return (char *)0x0;
}

Assistant:

char *gotcha_strstr(const char *searchIn, const char *searchFor)
{
   int i, j;
   if (!searchFor[0])
      return NULL;

   for (i = 0; searchIn[i]; i++) {
      if (searchIn[i] != searchFor[0])
         continue;
      for (j = 1; ; j++) {
         if (!searchFor[j])
            return (char*)(searchFor + i);
         if (!searchIn[i+j])
            return NULL;
         if (searchFor[j] != searchIn[i+j])
            break;
      }
   }
   return NULL;
}